

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> * __thiscall
pugi::impl::(anonymous_namespace)::as_wide_impl_abi_cxx11_
          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,char *str,size_t size)

{
  pointer pwVar1;
  pointer pwVar2;
  char *pcVar3;
  long lVar4;
  _anonymous_namespace_ *p_Var5;
  long lVar6;
  _anonymous_namespace_ *p_Var7;
  long lVar8;
  
  lVar8 = 0;
  pcVar3 = str;
  p_Var7 = this;
  do {
    do {
      p_Var5 = p_Var7;
      lVar4 = 0;
      lVar6 = 3;
      while( true ) {
        if (pcVar3 + lVar4 == (char *)0x0) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          __return_storage_ptr__->_M_string_length = 0;
          (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
          std::__cxx11::wstring::resize((ulong)__return_storage_ptr__);
          if ((lVar8 != 0) &&
             (pwVar1 = (__return_storage_ptr__->_M_dataplus)._M_p,
             pwVar2 = (pointer)anon_unknown_0::utf8_decoder::
                               process<pugi::impl::(anonymous_namespace)::utf32_writer>
                                         (this,str,pwVar1), pwVar1 + lVar8 != pwVar2)) {
            __assert_fail("begin + length == end",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/JeffIrwin[P]maph/submodules/colormapper/submodules/pugixml/src/pugixml.cpp"
                          ,0x91a,
                          "std::basic_string<wchar_t> pugi::impl::(anonymous namespace)::as_wide_impl(const char *, size_t)"
                         );
          }
          return __return_storage_ptr__;
        }
        if (-1 < (char)p_Var5[lVar6 + -3]) break;
        lVar4 = lVar4 + -1;
        lVar6 = lVar6 + 1;
      }
      lVar8 = lVar8 + 1;
      p_Var7 = p_Var5 + (1 - lVar4);
      pcVar3 = pcVar3 + lVar4 + -1;
    } while ((pcVar3 < (char *)0x4) || ((((int)p_Var5 - (int)lVar4) + 1U & 3) != 0));
    do {
      if ((*(uint *)p_Var7 & 0x80808080) != 0) break;
      lVar8 = lVar8 + 4;
      p_Var7 = p_Var7 + 4;
      pcVar3 = pcVar3 + -4;
    } while ((char *)0x3 < pcVar3);
  } while( true );
}

Assistant:

PUGI__FN std::basic_string<wchar_t> as_wide_impl(const char* str, size_t size)
	{
		const uint8_t* data = reinterpret_cast<const uint8_t*>(str);

		// first pass: get length in wchar_t units
		size_t length = utf8_decoder::process(data, size, 0, wchar_counter());

		// allocate resulting string
		std::basic_string<wchar_t> result;
		result.resize(length);

		// second pass: convert to wchar_t
		if (length > 0)
		{
			wchar_writer::value_type begin = reinterpret_cast<wchar_writer::value_type>(&result[0]);
			wchar_writer::value_type end = utf8_decoder::process(data, size, begin, wchar_writer());

			assert(begin + length == end);
			(void)!end;
		}

		return result;
	}